

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Member.cpp
# Opt level: O0

MemberListEntry * __thiscall
MemberListEntry::operator=(MemberListEntry *this,MemberListEntry *anotherMLE)

{
  undefined1 local_30 [8];
  MemberListEntry temp;
  MemberListEntry *anotherMLE_local;
  MemberListEntry *this_local;
  
  temp.timestamp = (long)anotherMLE;
  MemberListEntry((MemberListEntry *)local_30,anotherMLE);
  std::swap<long>(&this->heartbeat,(long *)&temp);
  std::swap<int>(&this->id,(int *)local_30);
  std::swap<short>(&this->port,(short *)(local_30 + 4));
  std::swap<long>(&this->timestamp,&temp.heartbeat);
  return this;
}

Assistant:

MemberListEntry& MemberListEntry::operator =(const MemberListEntry &anotherMLE) {
	MemberListEntry temp(anotherMLE);
	swap(heartbeat, temp.heartbeat);
	swap(id, temp.id);
	swap(port, temp.port);
	swap(timestamp, temp.timestamp);
	return *this;
}